

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cc
# Opt level: O0

size_t xemmai::anon_unknown_18::f_expand(void ***a_pc,t_pvalue *a_stack,size_t a_n)

{
  anon_class_24_3_351435c3 a_do;
  bool bVar1;
  t_object *ptVar2;
  t_tuple *this;
  t_svalue *a_value;
  t_list *this_00;
  t_global *this_01;
  t_value<xemmai::t_pointer> local_a0;
  t_value<xemmai::t_pointer> local_90;
  t_tuple *local_80;
  size_t i_1;
  t_value<xemmai::t_pointer> size;
  t_list *list;
  size_t i;
  t_tuple *tuple;
  size_t n;
  t_pvalue x;
  size_t a_n_local;
  t_pvalue *a_stack_local;
  void ***a_pc_local;
  
  x.field_0 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2)a_n;
  a_stack_local = (t_pvalue *)a_pc;
  if (a_n == 0) {
    a_n_local = (size_t)a_stack;
    __assert_fail("a_n > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/src/code.cc"
                  ,0x1a,
                  "size_t xemmai::(anonymous namespace)::f_expand(void **&, t_pvalue *, size_t)");
  }
  a_n_local = (size_t)(a_stack + a_n + 1);
  t_value<xemmai::t_pointer>::t_value
            ((t_value<xemmai::t_pointer> *)&n,(t_value<xemmai::t_pointer> *)a_n_local);
  ptVar2 = t_pointer::operator_cast_to_t_object_((t_pointer *)&n);
  bVar1 = f_is<xemmai::t_tuple>(ptVar2);
  if (bVar1) {
    ptVar2 = t_pointer::operator->((t_pointer *)&n);
    this = t_object::f_as<xemmai::t_tuple>(ptVar2);
    tuple = (t_tuple *)t_tuple::f_size(this);
    f_allocate((t_pvalue *)a_n_local,(size_t)tuple);
    for (list = (t_list *)0x0; list < tuple;
        list = (t_list *)((long)&(list->super_t_sharable).super_t_owned.v_owner + 1)) {
      a_value = t_tuple::operator[](this,(size_t)list);
      t_value<xemmai::t_pointer>::operator=
                ((t_value<xemmai::t_pointer> *)(a_n_local + (long)list * 0x10),a_value);
    }
  }
  else {
    ptVar2 = t_pointer::operator_cast_to_t_object_((t_pointer *)&n);
    bVar1 = f_is<xemmai::t_list>(ptVar2);
    if (bVar1) {
      ptVar2 = t_pointer::operator->((t_pointer *)&n);
      this_00 = t_object::f_as<xemmai::t_list>(ptVar2);
      size.field_0.v_integer = (intptr_t)&tuple;
      a_do.list = this_00;
      a_do.n = (size_t *)size.field_0.v_integer;
      a_do.a_stack = (t_pvalue **)&a_n_local;
      t_sharable::
      f_owned_or_shared<std::shared_lock,xemmai::(anonymous_namespace)::f_expand(void**&,xemmai::t_value<xemmai::t_pointer>*,unsigned_long)::__0>
                (&this_00->super_t_sharable,a_do);
    }
    else {
      this_01 = f_global();
      ptVar2 = t_global::f_symbol_size(this_01);
      t_value<xemmai::t_pointer>::f_invoke<>
                ((t_value<xemmai::t_pointer> *)&i_1,(t_object *)&n,(size_t *)ptVar2);
      ptVar2 = t_pointer::operator_cast_to_t_object_((t_pointer *)&i_1);
      f_check<unsigned_long>(ptVar2,L"size");
      tuple = (t_tuple *)
              f_as<unsigned_long,xemmai::t_value<xemmai::t_pointer>&>
                        ((t_value<xemmai::t_pointer> *)&i_1);
      f_allocate((t_pvalue *)a_n_local,(size_t)tuple);
      for (local_80 = (t_tuple *)0x0; local_80 < tuple;
          local_80 = (t_tuple *)((long)&local_80->v_size + 1)) {
        t_value<xemmai::t_pointer>::t_value<unsigned_long,_true>(&local_a0,(unsigned_long)local_80);
        t_value<xemmai::t_pointer>::f_get_at(&local_90,(t_pvalue *)&n);
        t_value<xemmai::t_pointer>::operator=
                  ((t_value<xemmai::t_pointer> *)(a_n_local + (long)local_80 * 0x10),&local_90);
      }
    }
  }
  return x.field_0.v_integer + -1 + (long)tuple;
}

Assistant:

size_t f_expand(void**& a_pc, t_pvalue* a_stack, size_t a_n)
{
	assert(a_n > 0);
	a_stack += a_n + 1;
	auto x = a_stack[0];
	size_t n;
	if (f_is<t_tuple>(x)) {
		auto& tuple = x->f_as<t_tuple>();
		n = tuple.f_size();
		f_allocate(a_stack, n);
		for (size_t i = 0; i < n; ++i) a_stack[i] = tuple[i];
	} else if (f_is<t_list>(x)) {
		auto& list = x->f_as<t_list>();
		list.f_owned_or_shared<std::shared_lock>([&]
		{
			n = list.f_size();
			f_allocate(a_stack, n);
			for (size_t i = 0; i < n; ++i) a_stack[i] = list[i];
		});
	} else {
		static size_t index;
		auto size = x.f_invoke(f_global()->f_symbol_size(), index);
		f_check<size_t>(size, L"size");
		n = f_as<size_t>(size);
		f_allocate(a_stack, n);
		for (size_t i = 0; i < n; ++i) a_stack[i] = x.f_get_at(i);
	}
	return a_n - 1 + n;
}